

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# R3_binary_search_tree.c
# Opt level: O1

int main(void)

{
  int i;
  int key;
  NODE *root;
  NODE *local_18;
  
  local_18 = (NODE *)0x0;
  key = 0;
  do {
    insert(&local_18,key);
    key = key + 1;
  } while (key != 10);
  inorder(local_18);
  putchar(10);
  delete(&local_18,3);
  inorder(local_18);
  putchar(10);
  return 0;
}

Assistant:

int main() {
  NODE *root = NULL;
  for (int i = 0; i < 10; i++) {
    insert(&root, i);
  }
  inorder(root);
  printf("\n");

  delete (&root, 3);
  inorder(root);
  printf("\n");

  return 0;
}